

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void ipc_on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  uv_tcp_t *puVar5;
  int64_t eval_b;
  int64_t eval_a;
  int64_t local_18;
  int64_t eval_b_3;
  
  if (connection_accepted != '\0') {
    return;
  }
  local_18 = eval_a;
  eval_a = (int64_t)(long)status;
  if ((char *)(long)status != (char *)0x0) {
    pcVar3 = "status";
    uVar2 = 0x26a;
    goto LAB_001514f9;
  }
  if (server != (uv_stream_t *)&tcp_server) {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar3 = "&tcp_server";
    uVar2 = 0x26b;
    puVar5 = &tcp_server;
    pcVar4 = "server";
    goto LAB_00151546;
  }
  iVar1 = uv_tcp_init(tcp_server.loop,&conn.conn);
  eval_a = (int64_t)(long)iVar1;
  if ((char *)(long)iVar1 == (char *)0x0) {
    iVar1 = uv_accept((uv_stream_t *)&tcp_server,(uv_stream_t *)&conn.conn);
    eval_a = (int64_t)(long)iVar1;
    if ((char *)(long)iVar1 != (char *)0x0) {
      pcVar3 = "r";
      uVar2 = 0x271;
      goto LAB_001514f9;
    }
    uv_close((uv_handle_t *)&conn.conn,close_cb);
    _eval_a = uv_buf_init("accepted_connection\n",0x14);
    iVar1 = uv_write2(&conn_notify_req,(uv_stream_t *)&channel,(uv_buf_t *)&eval_a,1,
                      (uv_stream_t *)0x0,conn_notify_write_cb);
    eval_b_3 = 0;
    if ((uv_tcp_t *)(long)iVar1 == (uv_tcp_t *)0x0) {
      connection_accepted = 1;
      return;
    }
    pcVar3 = "r";
    uVar2 = 0x278;
    puVar5 = (uv_tcp_t *)(long)iVar1;
  }
  else {
    pcVar3 = "r";
    uVar2 = 0x26e;
LAB_001514f9:
    puVar5 = (uv_tcp_t *)eval_a;
  }
  server = (uv_stream_t *)0x0;
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar4 = "0";
LAB_00151546:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
          ,uVar2,pcVar3,"==",pcVar4,puVar5,"==",server);
  abort();
}

Assistant:

static void ipc_on_connection(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;

  if (!connection_accepted) {
    /*
     * Accept the connection and close it.  Also let the other
     * side know.
     */
    ASSERT_OK(status);
    ASSERT_PTR_EQ(&tcp_server, server);

    r = uv_tcp_init(server->loop, &conn.conn);
    ASSERT_OK(r);

    r = uv_accept(server, (uv_stream_t*)&conn.conn);
    ASSERT_OK(r);

    uv_close((uv_handle_t*)&conn.conn, close_cb);

    buf = uv_buf_init("accepted_connection\n", 20);
    r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
      NULL, conn_notify_write_cb);
    ASSERT_OK(r);

    connection_accepted = 1;
  }
}